

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

int __thiscall NNTreeIterator::remove(NNTreeIterator *this,char *__filename)

{
  string *key;
  int iVar1;
  NNTreeImpl *pNVar2;
  QPDF *qpdf;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  string *key_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  logic_error *plVar5;
  iterator iVar6;
  _List_node_base *p_Var7;
  iterator result;
  QPDFObjectHandle kids;
  QPDFObjectHandle items;
  string local_c8;
  _List_node_base *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_98;
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  if (this->item_number < 0) {
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"attempt made to remove an invalid iterator");
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  (*(code *)**(undefined8 **)this->impl->details)();
  QPDFObjectHandle::getKey(&local_60,(string *)&this->node);
  iVar4 = QPDFObjectHandle::getArrayNItems(&local_60);
  if (iVar4 < this->item_number + 2) {
    qpdf = this->impl->qpdf;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"found short items array while removing an item","");
    ::error(qpdf,&this->node,&local_c8);
LAB_00130328:
    plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar5,"NNTreeIterator::remove: item_number > nitems after erase")
    ;
    __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFObjectHandle::eraseItem(&local_60,this->item_number);
  QPDFObjectHandle::eraseItem(&local_60,this->item_number);
  if (iVar4 < 3) {
    if ((this->path).
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->path) {
      local_98 = &(this->node).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      bVar3 = false;
      local_a0 = (_List_node_base *)&this->path;
      do {
        p_Var7 = local_a0;
        if ((this->path).
            super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            ._M_impl._M_node.super__List_node_base._M_next != local_a0) {
          p_Var7 = (this->path).
                   super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
        }
        iVar6._M_node = p_Var7->_M_prev;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Kids","");
        key = (string *)(p_Var7 + 1);
        QPDFObjectHandle::getKey(&local_80,key);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        QPDFObjectHandle::eraseItem(&local_80,*(int *)&p_Var7[2]._M_next);
        iVar4 = QPDFObjectHandle::getArrayNItems(&local_80);
        if (iVar4 < 1) {
          if (iVar6._M_node == local_a0) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Kids","");
            QPDFObjectHandle::removeKey((QPDFObjectHandle *)key,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            key_00 = (string *)(*(code *)**(undefined8 **)this->impl->details)();
            QPDFObjectHandle::newArray();
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)key,key_00,(QPDFObjectHandle *)&local_c8);
            p_Var7 = local_a0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
            }
            std::__cxx11::
            _List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
            _M_clear((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                      *)p_Var7);
            (this->path).
            super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            ._M_impl._M_node.super__List_node_base._M_prev = p_Var7;
            (this->path).
            super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            ._M_impl._M_node.super__List_node_base._M_next = p_Var7;
            (this->path).
            super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            ._M_impl._M_node._M_size = 0;
            pNVar2 = this->impl;
            (this->node).super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pNVar2->oh).super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_98,&(pNVar2->oh).super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
            this->item_number = -1;
            bVar3 = true;
            updateIValue(this,true);
            iVar4 = extraout_EAX_00;
          }
          else {
            std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
            _M_erase((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                      *)local_a0,
                     (this->path).
                     super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                     ._M_impl._M_node.super__List_node_base._M_prev);
            iVar4 = extraout_EAX;
          }
        }
        else {
          if (*(int *)&p_Var7[2]._M_next == 0 || *(int *)&p_Var7[2]._M_next == iVar4) {
            local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)p_Var7[1]._M_next;
            local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_prev;
            if (local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_90.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_90.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            resetLimits(this,&local_90,iVar6);
            if (local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_90.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
          }
          if (*(int *)&p_Var7[2]._M_next == iVar4) {
            local_c8._M_dataplus._M_p = (pointer)0x0;
            local_c8._M_string_length = 0;
            (this->node).super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_98,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                &local_c8._M_string_length);
            this->item_number = -1;
            updateIValue(this,true);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
            }
            *(int *)&p_Var7[2]._M_next = *(int *)&p_Var7[2]._M_next + -1;
            QPDFObjectHandle::getArrayItem(&local_40,(int)&local_80);
            bVar3 = deepen(this,&local_40,false,true);
            iVar4 = (int)CONCAT71(extraout_var,bVar3);
            if (local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
              iVar4 = extraout_EAX_01;
            }
            bVar3 = true;
            if (-1 < this->item_number) {
              increment(this,false);
              iVar4 = extraout_EAX_02;
            }
          }
          else {
            QPDFObjectHandle::getArrayItem(&local_50,(int)&local_80);
            bVar3 = deepen(this,&local_50,true,true);
            iVar4 = (int)CONCAT71(extraout_var_00,bVar3);
            bVar3 = true;
            if (local_50.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_50.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
              iVar4 = extraout_EAX_03;
            }
          }
        }
        if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
          iVar4 = extraout_EAX_04;
        }
      } while (!bVar3);
      goto LAB_00130299;
    }
    pNVar2 = this->impl;
    (this->node).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pNVar2->oh).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->node).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pNVar2->oh).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this->item_number = -1;
  }
  else {
    iVar4 = iVar4 + -2;
    if (this->item_number == iVar4 || this->item_number == 0) {
      local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this->node).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->node).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      iVar6._M_node = (_List_node_base *)&this->path;
      if ((this->path).
          super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
          ._M_impl._M_node.super__List_node_base._M_next != iVar6._M_node) {
        iVar6._M_node =
             (this->path).
             super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
      }
      resetLimits(this,&local_70,iVar6);
      if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    iVar1 = this->item_number;
    if (iVar1 == iVar4) {
      this->item_number = iVar1 + -2;
      increment(this,false);
      iVar4 = extraout_EAX_05;
      goto LAB_00130299;
    }
    if (iVar4 <= iVar1) goto LAB_00130328;
  }
  updateIValue(this,true);
  iVar4 = extraout_EAX_06;
LAB_00130299:
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    iVar4 = extraout_EAX_07;
  }
  return iVar4;
}

Assistant:

bool
NNTreeIterator::valid() const
{
    return this->item_number >= 0;
}